

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
deqp::gles31::Functional::getScalarSizes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          *symbols)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  int local_30;
  int ndx;
  allocator<int> local_1a;
  undefined1 local_19;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *local_18;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *symbols_local;
  vector<int,_std::allocator<int>_> *sizes;
  
  local_19 = 0;
  local_18 = symbols;
  symbols_local =
       (vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
        *)__return_storage_ptr__;
  sVar2 = std::
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          ::size(symbols);
  std::allocator<int>::allocator(&local_1a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar2,&local_1a);
  std::allocator<int>::~allocator(&local_1a);
  for (local_30 = 0;
      sVar2 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::size(local_18), local_30 < (int)sVar2; local_30 = local_30 + 1) {
    pvVar3 = std::
             vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ::operator[](local_18,(long)local_30);
    iVar1 = glu::VarType::getScalarSize(&pvVar3->varType);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_30);
    *pvVar4 = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<int> getScalarSizes (const vector<Symbol>& symbols)
{
	vector<int> sizes(symbols.size());
	for (int ndx = 0; ndx < (int)symbols.size(); ++ndx)
		sizes[ndx] = symbols[ndx].varType.getScalarSize();
	return sizes;
}